

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_affine.cpp
# Opt level: O0

trans_affine * __thiscall
agg::trans_affine::parl_to_rect
          (trans_affine *this,double *parl,double x1,double y1,double x2,double y2)

{
  double local_68;
  double dst [6];
  double y2_local;
  double x2_local;
  double y1_local;
  double x1_local;
  double *parl_local;
  trans_affine *this_local;
  
  local_68 = x1;
  dst[0] = y1;
  dst[1] = x2;
  dst[2] = y1;
  dst[3] = x2;
  dst[4] = y2;
  dst[5] = y2;
  parl_to_parl(this,parl,&local_68);
  return this;
}

Assistant:

const trans_affine& trans_affine::parl_to_rect(const double* parl, 
                                                   double x1, double y1, 
                                                   double x2, double y2)
    {
        double dst[6];
        dst[0] = x1; dst[1] = y1;
        dst[2] = x2; dst[3] = y1;
        dst[4] = x2; dst[5] = y2;
        parl_to_parl(parl, dst);
        return *this;
    }